

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>
::~Matrix(Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>
          *this)

{
  Column_container *this_00;
  Column_settings *pCVar1;
  pointer puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  pCVar1 = this->colSettings_;
  this_00 = &(this->matrix_).matrix_;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
  ::_M_erase_at_end(this_00,(this->matrix_).matrix_.
                            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->matrix_).pivotToColumnIndex_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->matrix_).pivotToColumnIndex_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->matrix_).pivotToColumnIndex_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  (this->matrix_).nextIndex_ = 0;
  (this->matrix_).colSettings_ = pCVar1;
  pCVar1 = this->colSettings_;
  if (pCVar1 != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)&pCVar1->entryConstructor);
    puVar2 = (pCVar1->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pCVar1->operators).inverse_.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
  }
  operator_delete(pCVar1,0x58);
  puVar2 = (this->matrix_).pivotToColumnIndex_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->matrix_).pivotToColumnIndex_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
  ::~vector(this_00);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->matrix_).super_Chain_pairing_option.indexToBar_._M_h);
  puVar4 = &((this->matrix_).super_Chain_pairing_option.barcode_.
             super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
  while ((Underlying_matrix *)puVar4 != &this->matrix_) {
    puVar3 = (undefined8 *)*puVar4;
    operator_delete(puVar4,0x20);
    puVar4 = puVar3;
  }
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::~Matrix()
{
  matrix_.reset(colSettings_);
  delete colSettings_;
}